

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_draw_string_ex(rf_font font,char *text,int text_len,rf_vec2 position,float font_size,
                      float spacing,rf_color tint)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  rf_int rVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  rf_rec source_rec;
  rf_rec dest_rec;
  rf_decoded_rune decoded_rune;
  float local_c4;
  float local_88;
  float fStack_84;
  rf_decoded_rune local_60;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  if (0 < text_len) {
    fVar8 = font_size / (float)font.base_size;
    fStack_84 = position.y;
    local_48 = fStack_84;
    fStack_44 = fStack_84;
    fStack_40 = fStack_84;
    fStack_3c = fStack_84;
    local_c4 = 0.0;
    iVar1 = 0;
    lVar5 = 0;
    do {
      rf_decode_utf8_char(&local_60,text + lVar5,text_len - lVar5);
      lVar6 = -1;
      if (0 < font.glyphs_count) {
        lVar2 = 0;
        piVar3 = &(font.glyphs)->codepoint;
        rVar4 = font.glyphs_count;
        do {
          if (*piVar3 == local_60.codepoint) {
            lVar6 = lVar2 >> 0x20;
            break;
          }
          lVar2 = lVar2 + 0x100000000;
          piVar3 = piVar3 + 8;
          rVar4 = rVar4 + -1;
        } while (rVar4 != 0);
      }
      if (local_60.codepoint == 0x3f) {
        local_60.bytes_processed = 1;
      }
      rVar4 = local_60.bytes_processed;
      if (local_60.codepoint == 0x20) {
LAB_0014f106:
        if (font.glyphs[lVar6].advance_x == 0) {
          fVar7 = font.glyphs[lVar6].field_0.rec.width;
        }
        else {
          fVar7 = (float)font.glyphs[lVar6].advance_x;
        }
        local_c4 = local_c4 + fVar7 * fVar8 + spacing;
      }
      else {
        if (local_60.codepoint != 10) {
          local_88 = position.x;
          dest_rec.x = (float)font.glyphs[lVar6].offset_x * fVar8 + local_88 + local_c4;
          dest_rec.y = (float)font.glyphs[lVar6].offset_y * fVar8 + (float)iVar1 + local_48;
          dest_rec.width = font.glyphs[lVar6].field_0.rec.width * fVar8;
          dest_rec.height = font.glyphs[lVar6].field_0.rec.height * fVar8;
          source_rec._8_8_ = *(undefined8 *)((long)&font.glyphs[lVar6].field_0 + 8);
          source_rec._0_8_ = *(undefined8 *)&font.glyphs[lVar6].field_0;
          rf_draw_texture_region(font.texture,source_rec,dest_rec,(rf_vec2)0x0,0.0,tint);
          goto LAB_0014f106;
        }
        iVar1 = iVar1 + (int)((float)(font.base_size / 2 + font.base_size) * fVar8);
        local_c4 = 0.0;
      }
      lVar5 = lVar5 + rVar4;
    } while (lVar5 < text_len);
  }
  return;
}

Assistant:

RF_API void rf_draw_string_ex(rf_font font, const char* text, int text_len, rf_vec2 position, float font_size, float spacing, rf_color tint)
{
    int text_offset_y = 0; // Required for line break!
    float text_offset_x = 0.0f; // Offset between characters
    float scale_factor = 0.0f;

    int letter = 0; // Current character
    int index  = 0; // Index position in sprite font

    scale_factor = font_size / font.base_size;

    for (rf_int i = 0; i < text_len; i++)
    {
        rf_decoded_rune decoded_rune = rf_decode_utf8_char(&text[i], text_len - i);
        letter = decoded_rune.codepoint;
        index = rf_get_glyph_index(font, letter);

        // NOTE: Normally we exit the decoding sequence as soon as a bad unsigned char is found (and return 0x3f)
        // but we need to draw all of the bad bytes using the '?' symbol so to not skip any we set 'next = 1'
        if (letter == 0x3f) decoded_rune.bytes_processed = 1;
        i += (decoded_rune.bytes_processed - 1);

        if (letter == '\n')
        {
            // NOTE: Fixed line spacing of 1.5 lines
            text_offset_y += (int)((font.base_size + font.base_size/2)*scale_factor);
            text_offset_x = 0.0f;
        }
        else
        {
            if (letter != ' ')
            {
                rf_rec src_rec = font.glyphs[index].rec;
                rf_rec dst_rec = {  position.x + text_offset_x + font.glyphs[index].offset_x * scale_factor,
                                    position.y + text_offset_y + font.glyphs[index].offset_y * scale_factor,
                                    font.glyphs[index].width  * scale_factor,
                                    font.glyphs[index].height * scale_factor };
                rf_draw_texture_region(font.texture, src_rec, dst_rec, (rf_vec2){0}, 0.0f, tint);
            }

            if (font.glyphs[index].advance_x == 0) text_offset_x += ((float)font.glyphs[index].width * scale_factor + spacing);
            else text_offset_x += ((float)font.glyphs[index].advance_x * scale_factor + spacing);
        }
    }
}